

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::GreatestCommonDivisorOperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  UnifiedVectorFormat *in_RCX;
  ValidityMask *in_RDX;
  ValidityMask *in_RSI;
  ulong in_RDI;
  hugeint_t *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat *this;
  UnifiedVectorFormat local_c8 [16];
  UnifiedVectorFormat local_b8 [56];
  UnifiedVectorFormat local_80 [23];
  undefined1 in_stack_ffffffffffffff97;
  idx_t in_stack_ffffffffffffff98;
  SelectionVector *in_stack_ffffffffffffffa0;
  SelectionVector *in_stack_ffffffffffffffa8;
  hugeint_t *in_stack_ffffffffffffffb0;
  hugeint_t *in_stack_ffffffffffffffb8;
  hugeint_t *in_stack_ffffffffffffffc0;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_80);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_c8);
  duckdb::Vector::ToUnifiedFormat(in_RDI,in_RCX);
  duckdb::Vector::ToUnifiedFormat((ulong)in_RSI,in_RCX);
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xe28b1d);
  UnifiedVectorFormat::GetData<duckdb::hugeint_t>(local_80);
  UnifiedVectorFormat::GetData<duckdb::hugeint_t>(local_c8);
  this = local_b8;
  FlatVector::Validity((Vector *)0xe28b9e);
  ExecuteGenericLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::GreatestCommonDivisorOperator,bool>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (ValidityMask *)in_RCX,in_RDX,in_RSI,(bool)in_stack_ffffffffffffff97);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}